

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

_Bool M680X_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *inst_info)

{
  inst_pageX iVar1;
  inst_page1 iVar2;
  m680x_op_type mVar3;
  m680x_info *info;
  cs_detail *__s;
  inst_pageX *piVar4;
  _Bool *p_Var5;
  m680x_info *pmVar6;
  ulong uVar7;
  e_cpu_type eVar8;
  long lVar9;
  long lVar10;
  ushort uVar11;
  uint64_t uVar12;
  _Bool _Var13;
  uint uVar14;
  uint uVar15;
  m680x_insn mVar16;
  uint16_t *puVar17;
  byte bVar18;
  ushort uVar19;
  uint16_t uVar20;
  insn_props iVar21;
  cpu_tables *pcVar22;
  uint8_t *puVar23;
  uint32_t uVar24;
  e_access access;
  uint uVar25;
  undefined4 *puVar26;
  m680x_reg mVar27;
  int iVar28;
  int iVar29;
  MCInst *pMVar30;
  long lVar31;
  cs_m680x_op *pcVar32;
  byte opcode;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  ushort local_92;
  uint local_90;
  insn_desc local_8c;
  MCInst *local_78;
  uint16_t local_6a;
  uint64_t local_68;
  uint8_t *local_60;
  ulong local_58;
  uint local_50;
  uint local_4c;
  uint16_t *local_48;
  cs_detail *local_40;
  size_t local_38;
  
  info = *(m680x_info **)(ud + 0x10);
  local_78 = MI;
  MCInst_clear(MI);
  uVar25 = *(uint *)(ud + 4);
  if ((uVar25 & 8) == 0) {
    if ((uVar25 & 0x10) != 0) {
      eVar8 = M680X_CPU_TYPE_6801;
      goto LAB_0024a9f2;
    }
    if ((uVar25 & 0x20) != 0) {
      eVar8 = M680X_CPU_TYPE_6805;
      goto LAB_0024a9f2;
    }
    if ((uVar25 & 0x40) != 0) {
      eVar8 = M680X_CPU_TYPE_6808;
      goto LAB_0024a9f2;
    }
    if ((uVar25 >> 10 & 1) != 0) {
      eVar8 = M680X_CPU_TYPE_HCS08;
      goto LAB_0024a9f2;
    }
    if ((char)uVar25 < '\0') {
      eVar8 = M680X_CPU_TYPE_6809;
      goto LAB_0024a9f2;
    }
    if ((uVar25 & 2) != 0) {
      eVar8 = M680X_CPU_TYPE_6301;
      goto LAB_0024a9f2;
    }
    if ((uVar25 & 4) != 0) {
      eVar8 = M680X_CPU_TYPE_6309;
      goto LAB_0024a9f2;
    }
    if ((uVar25 >> 8 & 1) != 0) {
      eVar8 = M680X_CPU_TYPE_6811;
      goto LAB_0024a9f2;
    }
    if ((uVar25 >> 9 & 1) != 0) {
      eVar8 = M680X_CPU_TYPE_CPU12;
      goto LAB_0024a9f2;
    }
    local_38 = 1;
    local_48 = size;
  }
  else {
    eVar8 = M680X_CPU_TYPE_6800;
LAB_0024a9f2:
    info->code = code;
    uVar24 = (uint)code_len & 0xffff;
    info->size = uVar24;
    local_6a = (uint16_t)address;
    info->offset = local_6a;
    info->cpu_type = eVar8;
    pcVar22 = g_cpu_tables + eVar8;
    info->cpu = pcVar22;
    __s = local_78->flat_insn->detail;
    local_90 = (uint)address;
    local_68 = address;
    local_38 = code_len;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x134);
      pcVar22 = info->cpu;
      local_90 = (uint)info->offset;
      uVar24 = info->size;
    }
    local_58 = CONCAT44(local_58._4_4_,uVar24);
    local_8c.insn = M680X_INS_INVLD;
    local_8c.hid[0] = illgl_hid;
    local_8c.hid[1] = illgl_hid;
    local_8c.insn_size = 0;
    local_8c._18_2_ = 0;
    local_40 = __s;
    memset(&info->m680x,0,0xdc);
    uVar34 = local_58 & 0xffffffff;
    info->insn_size = '\x01';
    local_90 = local_90 & 0xffff;
    uVar14 = ((uint)local_68 & 0xffff) - local_90;
    uVar25 = 0;
    uVar19 = local_92;
    if (uVar14 < (uint)local_58) {
      uVar15 = 5;
      local_50 = 5;
      local_4c = (uint)local_68 + 1;
      local_60 = info->code;
      bVar18 = local_60[(int)uVar14];
      uVar25 = (uint)bVar18;
      local_8c.opcode = (uint32_t)bVar18;
      lVar31 = -3;
      do {
        opcode = bVar18;
        uVar14 = uVar15;
        if (((lVar31 == 0) || (lVar10 = lVar31 + 3, pcVar22->pageX_table_size[lVar10] == 0)) ||
           (piVar4 = (inst_pageX *)pcVar22->pageX_table_size[lVar31], uVar14 = local_50,
           piVar4 == (inst_pageX *)0x0)) goto LAB_0024ab8e;
        lVar9 = lVar31 + 3;
        lVar31 = lVar31 + 1;
      } while (pcVar22->pageX_prefix[lVar9] != bVar18);
      uVar14 = (local_4c & 0xffff) - local_90;
      local_50 = uVar15;
      if ((uint)local_58 <= uVar14) goto LAB_0024b447;
      opcode = local_60[(int)uVar14];
      uVar25 = (uint)CONCAT11(bVar18,opcode);
      local_8c.opcode = uVar25;
      uVar14 = binary_search(piVar4,(int)pcVar22->pageX_table_size[lVar10],opcode);
      uVar19 = local_92;
      if ((int)uVar14 < 0) goto LAB_0024b447;
      local_4c = (int)local_68 + 2;
      iVar1 = piVar4[uVar14];
      local_8c._12_8_ = CONCAT44(local_8c._16_4_,(uint)iVar1 >> 0x17) & 0xffffffff0000003f;
      uVar15 = (uint)iVar1 >> 8 & 0x1ff;
      uVar33 = CONCAT44((uint)iVar1 >> 0x11,(uint)iVar1 >> 8);
      uVar34 = local_58 & 0xffffffff;
      uVar14 = local_50;
      if (uVar15 == 0x9f) {
LAB_0024ab8e:
        local_50 = uVar14;
        iVar2 = pcVar22->inst_page1_table[opcode];
        uVar15 = (uint)iVar2 & 0x1ff;
        uVar33 = CONCAT44((uint)iVar2 >> 9,iVar2);
        local_8c._12_8_ = CONCAT44(local_8c._16_4_,(uint)iVar2 >> 0xf) & 0xffffffff0000003f;
      }
      local_8c._4_8_ = uVar33 & 0x3f000001ff;
      if (uVar15 == 0x9f) {
        lVar31 = -2;
        local_48 = size;
        do {
          size = local_48;
          uVar19 = local_92;
          if (((lVar31 == 0) || (*(long *)(pcVar22->pageX_prefix + lVar31 * 8) == 0)) ||
             (piVar4 = (inst_pageX *)pcVar22->overlay_table_size[lVar31],
             piVar4 == (inst_pageX *)0x0)) goto LAB_0024b447;
          uVar14 = binary_search(piVar4,(int)*(long *)(pcVar22->pageX_prefix + lVar31 * 8),opcode);
          uVar34 = local_58 & 0xffffffff;
          lVar31 = lVar31 + 1;
        } while ((int)uVar14 < 0);
        iVar1 = piVar4[uVar14];
        local_8c._12_8_ = CONCAT44(local_8c._16_4_,(uint)iVar1 >> 0x17) & 0xffffffff0000003f;
        uVar15 = (uint)iVar1 >> 8 & 0x1ff;
        local_8c._4_8_ = CONCAT44((uint)iVar1 >> 0x11,(uint)iVar1 >> 8) & 0x3f000001ff;
        size = local_48;
      }
      local_8c.insn_size = (ushort)local_4c - (short)local_68;
      uVar19 = local_92;
      if ((uVar15 == 0) || (uVar15 == 0x9f)) goto LAB_0024b447;
      puVar17 = &local_92;
      local_92 = (ushort)local_4c;
      for (lVar31 = 2; uVar11 = local_92, uVar25 = local_8c.opcode, uVar19 = local_92, lVar31 != 4;
          lVar31 = lVar31 + 1) {
        puVar17 = (uint16_t *)0x1;
        uVar14 = (uint)uVar34;
        uVar20 = local_8c.insn_size;
        switch(local_8c.hid[lVar31 + -2]) {
        case illgl_hid:
        case inh_hid:
        case opidx_hid:
        case idxX0_hid:
        case idxX0p_hid:
          goto switchD_0024ac93_caseD_0;
        case rel8_hid:
        case imm8_hid:
        case dir_hid:
        case idxX_hid:
        case idxY_hid:
        case rbits_hid:
        case idxS_hid:
        case idxXp_hid:
        case index_hid:
          goto switchD_0024ac93_caseD_1;
        case rel16_hid:
        case imm16_hid:
        case ext_hid:
        case opidxdr_hid:
        case idxX16_hid:
        case imm8rel_hid:
        case idxS16_hid:
          goto switchD_0024ac93_caseD_2;
        case imm32_hid:
          local_8c.insn_size = local_8c.insn_size + 4;
          puVar17 = (uint16_t *)(ulong)((local_92 + 3 & 0xffff) - local_90 < uVar14);
          local_92 = local_92 + 4;
          break;
        case idx09_hid:
          local_8c.insn_size = local_8c.insn_size + 1;
          uVar19 = local_92 + 1;
          if (uVar14 <= local_92 - local_90) goto LAB_0024b447;
          switch(local_60[(int)(local_92 - local_90)] & 0x9f) {
          case 0x87:
          case 0x8a:
          case 0x8e:
          case 0x8f:
          case 0x90:
          case 0x92:
          case 0x97:
          case 0x9a:
          case 0x9e:
            puVar17 = (uint16_t *)0x0;
            local_92 = uVar19;
            break;
          case 0x88:
          case 0x8c:
          case 0x98:
          case 0x9c:
            local_8c.insn_size = uVar20 + 2;
            goto LAB_0024af42;
          case 0x89:
          case 0x8d:
          case 0x99:
          case 0x9d:
            bVar35 = (local_92 + 2 & 0xffff) - local_90 < uVar14;
            goto LAB_0024afb1;
          default:
            puVar17 = (uint16_t *)0x1;
            local_92 = uVar19;
            break;
          case 0x9f:
            bVar35 = (local_92 + 2 & 0xffff) - local_90 < uVar14 &&
                     (local_60[(int)(local_92 - local_90)] & 0x60) == 0;
LAB_0024afb1:
            local_8c.insn_size = uVar20 + 3;
            puVar17 = (uint16_t *)(ulong)bVar35;
            local_92 = local_92 + 3;
          }
          break;
        case rr09_hid:
          local_8c.insn_size = local_8c.insn_size + 1;
          uVar19 = local_92 + 1;
          uVar15 = (uint)local_92;
          if (uVar15 - local_90 < uVar14) {
            p_Var5 = pcVar22->tfr_reg_valid;
            local_92 = uVar19;
            if (p_Var5 == (_Bool *)0x0) goto switchD_0024ac93_caseD_0;
            if (p_Var5[local_60[(int)(uVar15 - local_90)] >> 4] == true) {
              puVar17 = (uint16_t *)(ulong)p_Var5[local_60[(int)(uVar15 - local_90)] & 0xf];
              break;
            }
          }
          goto LAB_0024b447;
        case bitmv_hid:
          local_8c.insn_size = local_8c.insn_size + 2;
          if ((local_92 - local_90 < uVar14) && (local_60[(int)(local_92 - local_90)] < 0xc0))
          goto LAB_0024af42;
          goto LAB_0024b447;
        case tfm_hid:
          local_8c.insn_size = local_8c.insn_size + 1;
          uVar19 = local_92 + 1;
          if ((local_92 - local_90 < uVar14) && (local_60[(int)(local_92 - local_90)] < 0x50)) {
            bVar35 = (local_60[(int)(local_92 - local_90)] & 0xf) < 5;
            local_92 = uVar19;
            goto LAB_0024acae;
          }
          goto LAB_0024b447;
        case idx12_hid:
          _Var13 = false;
          goto LAB_0024af50;
        case idx12s_hid:
          _Var13 = true;
LAB_0024af50:
          local_8c.insn_size = local_8c.insn_size + 1;
          uVar15 = (uint)local_92;
          uVar19 = local_92 + 1;
          if (uVar14 <= uVar15 - local_90) goto LAB_0024b447;
          local_92 = local_92 + 1;
          _Var13 = is_indexed12_post_byte_valid
                             (info,&local_92,local_60[(int)(uVar15 - local_90)],&local_8c,_Var13);
          puVar17 = (uint16_t *)(ulong)_Var13;
          uVar34 = local_58 & 0xffffffff;
          break;
        case rr12_hid:
          local_8c.insn_size = local_8c.insn_size + 1;
          uVar19 = local_92 + 1;
          if (uVar14 <= local_92 - local_90) goto LAB_0024b447;
          puVar17 = (uint16_t *)(ulong)(byte)(local_60[(int)(local_92 - local_90)] >> 3 ^ 1);
          local_92 = local_92 + 1;
          break;
        case loop_hid:
          local_8c.insn_size = local_8c.insn_size + 2;
          if (((local_92 - local_90 < uVar14) && (local_60[(int)(local_92 - local_90)] < 0xc0)) &&
             ((local_60[(int)(local_92 - local_90)] & 6) != 2)) {
LAB_0024af42:
            local_92 = local_92 + 2;
            bVar35 = (ushort)(uVar11 + 1) - local_90 < uVar14;
            goto LAB_0024acae;
          }
          goto LAB_0024b447;
        case imm8i12x_hid:
          local_8c.insn_size = local_8c.insn_size + 1;
          uVar15 = (uint)local_92;
          uVar19 = local_92 + 1;
          if (uVar14 <= uVar15 - local_90) goto LAB_0024b447;
          local_92 = local_92 + 1;
          _Var13 = is_indexed12_post_byte_valid
                             (info,&local_92,local_60[(int)(uVar15 - local_90)],&local_8c,false);
          uVar34 = local_58 & 0xffffffff;
          uVar25 = local_8c.opcode;
          uVar19 = local_92;
          if (!_Var13) goto LAB_0024b447;
switchD_0024ac93_caseD_1:
          local_8c.insn_size = local_8c.insn_size + 1;
          bVar35 = local_92 - local_90 < (uint)uVar34;
          local_92 = local_92 + 1;
LAB_0024acae:
          puVar17 = (uint16_t *)(ulong)bVar35;
          break;
        case imm16i12x_hid:
        case exti12x_hid:
          local_8c.insn_size = local_8c.insn_size + 1;
          uVar15 = (uint)local_92;
          uVar19 = local_92 + 1;
          if (uVar14 <= uVar15 - local_90) goto LAB_0024b447;
          local_92 = local_92 + 1;
          _Var13 = is_indexed12_post_byte_valid
                             (info,&local_92,local_60[(int)(uVar15 - local_90)],&local_8c,false);
          uVar34 = local_58 & 0xffffffff;
          uVar25 = local_8c.opcode;
          uVar19 = local_92;
          if (!_Var13) goto LAB_0024b447;
switchD_0024ac93_caseD_2:
          local_8c.insn_size = local_8c.insn_size + 2;
          puVar17 = (uint16_t *)(ulong)((local_92 + 1 & 0xffff) - local_90 < (uint)uVar34);
          local_92 = local_92 + 2;
          break;
        default:
          fprintf(_stderr,"Internal error: Unexpected instruction handler id %d\n");
          uVar25 = local_8c.opcode;
          uVar19 = local_92;
          goto LAB_0024b447;
        }
        uVar25 = local_8c.opcode;
        uVar19 = local_92;
        if (((ulong)puVar17 & 1) == 0) goto LAB_0024b447;
switchD_0024ac93_caseD_0:
      }
      if (((ulong)puVar17 & 1) == 0) goto LAB_0024b447;
      local_6a = ((short)local_68 - (ushort)(local_8c.opcode < 0x100)) + 2;
      info->insn = local_8c.insn;
      MCInst_setOpcode(local_78,local_8c.opcode);
      mVar27 = (uint)g_insn_props[info->insn] >> 9 & (M680X_REG_U|M680X_REG_S);
      if (mVar27 != M680X_REG_INVALID) {
        if (mVar27 == M680X_REG_HX) {
          mVar27 = (uint)(info->cpu->reg_byte_size[0xb] == '\0') * 2 + M680X_REG_HX;
        }
        add_reg_operand(info,mVar27);
        (info->m680x).flags = (info->m680x).flags | 1;
        mVar27 = (uint)g_insn_props[info->insn] >> 0xe & (M680X_REG_U|M680X_REG_S);
        if (mVar27 != M680X_REG_INVALID) {
          if (mVar27 == M680X_REG_HX) {
            mVar27 = (uint)(info->cpu->reg_byte_size[0xb] == '\0') * 2 + M680X_REG_HX;
          }
          add_reg_operand(info,mVar27);
          (info->m680x).flags = (info->m680x).flags | 2;
        }
      }
      pMVar30 = local_78;
      (*g_insn_handler[(ulong)local_8c._4_8_ >> 0x20])(local_78,info,&local_6a);
      (*g_insn_handler[local_8c._12_8_ & 0xffffffff])(pMVar30,info,&local_6a);
      mVar16 = info->insn;
      iVar21 = g_insn_props[mVar16];
      if ((local_40 != (cs_detail *)0x0) && (((uint)iVar21 & 7) != 0)) {
        bVar18 = local_40->groups_count;
        local_40->groups_count = bVar18 + 1;
        local_40->groups[bVar18] = iVar21._0_1_ & 0xf;
        mVar16 = info->insn;
        iVar21 = g_insn_props[mVar16];
      }
      pcVar22 = info->cpu;
      if (((((uint)iVar21 >> 0x13 & 1) != 0) && (pcVar22->insn_cc_not_modified[0] != mVar16)) &&
         (pcVar22->insn_cc_not_modified[1] != mVar16)) {
        add_reg_to_rw_list(local_78,M680X_REG_CC,MODIFY);
        mVar16 = info->insn;
        pcVar22 = info->cpu;
      }
      if ((pcVar22->insn_cc_not_modified[0] != mVar16) &&
         (pcVar22->insn_cc_not_modified[1] != mVar16)) {
        local_50 = (uint)g_insn_props[mVar16] >> 4 & 0x1f;
      }
      bVar35 = true;
      local_48 = size;
      if (local_78->flat_insn->detail != (cs_detail *)0x0) {
        bVar18 = (info->m680x).op_count;
        if (bVar18 != 0) {
          uVar34 = (ulong)local_50;
          uVar33 = 0;
          pmVar6 = info;
          while( true ) {
            pcVar32 = (pmVar6->m680x).operands;
            if (bVar18 <= uVar33) break;
            uVar7 = 3;
            if ((uint)uVar33 < 3) {
              uVar7 = uVar33;
            }
            if (local_78->flat_insn->detail != (cs_detail *)0x0) {
              mVar3 = pcVar32->type;
              if (mVar3 == M680X_OP_INDEXED) {
                add_reg_to_rw_list(local_78,(pmVar6->m680x).operands[0].field_1.reg,READ);
                if (((pmVar6->m680x).operands[0].field_1.imm == 0xd) &&
                   (info->cpu->reg_byte_size[0xc] != '\0')) {
                  add_reg_to_rw_list(local_78,M680X_REG_H,READ);
                }
                mVar27 = (pmVar6->m680x).operands[0].field_1.idx.offset_reg;
                if (mVar27 != M680X_REG_INVALID) {
                  add_reg_to_rw_list(local_78,mVar27,READ);
                }
                if ((((pmVar6->m680x).operands[0].field_1.idx.inc_dec != '\0') &&
                    (add_reg_to_rw_list(local_78,(pmVar6->m680x).operands[0].field_1.reg,WRITE),
                    (pmVar6->m680x).operands[0].field_1.imm == 0xd)) &&
                   (info->cpu->reg_byte_size[0xc] != '\0')) {
                  mVar27 = M680X_REG_H;
                  access = WRITE;
                  goto LAB_0024b21b;
                }
              }
              else if (mVar3 == M680X_OP_REGISTER) {
                access = g_access_mode_to_access[uVar7 & 0xffffffff][uVar34];
                mVar27 = (pmVar6->m680x).operands[0].field_1.reg;
LAB_0024b21b:
                add_reg_to_rw_list(local_78,mVar27,access);
              }
            }
            uVar33 = uVar33 + 1;
            bVar18 = (info->m680x).op_count;
            pmVar6 = (m680x_info *)pcVar32;
          }
          bVar35 = true;
          if (((local_78->flat_insn->detail == (cs_detail *)0x0) || (bVar35 = false, local_50 == 0))
             || (bVar18 == 0)) goto LAB_0024b336;
          puVar23 = &(info->m680x).operands[0].access;
          iVar28 = 0;
          for (uVar33 = 0; bVar18 != uVar33; uVar33 = uVar33 + 1) {
            iVar29 = iVar28;
            if (info->insn == M680X_INS_MULD) {
              iVar29 = 1;
            }
            if (uVar33 == 1) {
              iVar28 = iVar29;
            }
            iVar29 = (int)uVar33 + iVar28;
            if (2 < iVar29) {
              iVar29 = 3;
            }
            *puVar23 = (char)g_access_mode_to_access[iVar29][uVar34];
            puVar23 = puVar23 + 0x18;
          }
        }
        bVar35 = false;
      }
LAB_0024b336:
      if ((!bVar35) && (((uint)g_insn_props[info->insn] & 0x100000) != 0)) {
        puVar26 = &DAT_005490c8;
        for (local_58 = 0; local_58 != 0x33; local_58 = local_58 + 1) {
          if (info->insn == (&set_changed_regs_read_write_counts_changed_regs)[local_58 * 0xc]) {
            uVar25 = (&DAT_005490c4)[local_58 * 0xc];
            uVar34 = 0;
            while( true ) {
              mVar27 = puVar26[uVar34];
              if ((ulong)mVar27 == 0) break;
              if ((info->cpu->reg_byte_size[mVar27] != '\0') ||
                 (mVar27 = M680X_REG_X, info->insn == M680X_INS_MUL)) {
                uVar33 = 3;
                if ((int)uVar34 < 3) {
                  uVar33 = uVar34;
                }
                add_reg_to_rw_list(local_78,mVar27,
                                   g_access_mode_to_access[uVar33 & 0xffffffff][uVar25]);
              }
              uVar34 = uVar34 + 1;
            }
          }
          puVar26 = puVar26 + 0xc;
        }
      }
      info->insn_size = (uint8_t)local_8c.insn_size;
      uVar14 = local_8c.insn_size & 0xff;
      if ((local_8c._12_8_ & 0xff00000000) == 0) {
        _Var13 = false;
        uVar20 = 1;
        goto LAB_0024b47e;
      }
    }
    else {
LAB_0024b447:
      local_92 = uVar19;
      uVar12 = local_68;
      uVar14 = 1;
      pMVar30 = local_78;
      MCInst_setOpcode(local_78,uVar25);
      local_6a = (uint16_t)uVar12;
      illegal_hdlr(pMVar30,info,&local_6a);
      local_48 = size;
    }
    if (uVar14 <= local_38) {
      _Var13 = true;
      uVar20 = (uint16_t)uVar14;
      goto LAB_0024b47e;
    }
  }
  uVar20 = (uint16_t)local_38;
  _Var13 = false;
LAB_0024b47e:
  *local_48 = uVar20;
  return _Var13;
}

Assistant:

bool M680X_getInstruction(csh ud, const uint8_t *code, size_t code_len,
	MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned int insn_size = 0;
	e_cpu_type cpu_type = M680X_CPU_TYPE_INVALID; // No default CPU type
	cs_struct *handle = (cs_struct *)ud;
	m680x_info *info = (m680x_info *)handle->printer_info;

	MCInst_clear(MI);

	if (handle->mode & CS_MODE_M680X_6800)
		cpu_type = M680X_CPU_TYPE_6800;

	else if (handle->mode & CS_MODE_M680X_6801)
		cpu_type = M680X_CPU_TYPE_6801;

	else if (handle->mode & CS_MODE_M680X_6805)
		cpu_type = M680X_CPU_TYPE_6805;

	else if (handle->mode & CS_MODE_M680X_6808)
		cpu_type = M680X_CPU_TYPE_6808;

	else if (handle->mode & CS_MODE_M680X_HCS08)
		cpu_type = M680X_CPU_TYPE_HCS08;

	else if (handle->mode & CS_MODE_M680X_6809)
		cpu_type = M680X_CPU_TYPE_6809;

	else if (handle->mode & CS_MODE_M680X_6301)
		cpu_type = M680X_CPU_TYPE_6301;

	else if (handle->mode & CS_MODE_M680X_6309)
		cpu_type = M680X_CPU_TYPE_6309;

	else if (handle->mode & CS_MODE_M680X_6811)
		cpu_type = M680X_CPU_TYPE_6811;

	else if (handle->mode & CS_MODE_M680X_CPU12)
		cpu_type = M680X_CPU_TYPE_CPU12;

	if (cpu_type != M680X_CPU_TYPE_INVALID &&
		m680x_setup_internals(info, cpu_type, (uint16_t)address, code,
			code_len))
		insn_size = m680x_disassemble(MI, info, (uint16_t)address);

	if (insn_size == 0) {
		*size = 1;
		return false;
	}

	// Make sure we always stay within range
	if (insn_size > code_len) {
		*size = (uint16_t)code_len;
		return false;
	}
	else
		*size = (uint16_t)insn_size;

	return true;
}